

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O3

void __thiscall
duckdb::TableStatistics::InitializeRemoveColumn
          (TableStatistics *this,TableStatistics *parent,idx_t removed_column)

{
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var2;
  int iVar3;
  pointer __p;
  pthread_mutex_t *__mutex;
  reference __x;
  pointer psVar4;
  pointer pBVar5;
  pointer psVar6;
  size_type __n;
  
  shared_ptr<std::mutex,_true>::operator=(&this->stats_lock,&parent->stats_lock);
  __mutex = (pthread_mutex_t *)shared_ptr<std::mutex,_true>::operator*(&this->stats_lock);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    psVar4 = (parent->column_stats).
             super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = (parent->column_stats).
             super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar6 != psVar4) {
      __n = 0;
      do {
        if (removed_column != __n) {
          __x = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                          (&parent->column_stats,__n);
          ::std::
          vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
          ::push_back(&(this->column_stats).
                       super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                      ,__x);
          psVar4 = (parent->column_stats).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          psVar6 = (parent->column_stats).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)psVar6 - (long)psVar4 >> 4));
    }
    _Var1._M_head_impl =
         (parent->table_sample).
         super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
         .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (BlockingSample *)0x0) {
      (parent->table_sample).
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = (BlockingSample *)0x0;
      _Var2._M_head_impl =
           (this->table_sample).
           super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
           .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
      (this->table_sample).
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = _Var1._M_head_impl;
      if (_Var2._M_head_impl != (BlockingSample *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_BlockingSample + 8))();
      }
    }
    if ((this->table_sample).
        super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
        super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
        .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl !=
        (BlockingSample *)0x0) {
      pBVar5 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
               ::operator->(&this->table_sample);
      (*pBVar5->_vptr_BlockingSample[5])(pBVar5);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void TableStatistics::InitializeRemoveColumn(TableStatistics &parent, idx_t removed_column) {
	D_ASSERT(Empty());
	D_ASSERT(parent.stats_lock);

	stats_lock = parent.stats_lock;
	lock_guard<mutex> lock(*stats_lock);
	for (idx_t i = 0; i < parent.column_stats.size(); i++) {
		if (i != removed_column) {
			column_stats.push_back(parent.column_stats[i]);
		}
	}
	if (parent.table_sample) {
		table_sample = std::move(parent.table_sample);
	}
	if (table_sample) {
		table_sample->Destroy();
	}
}